

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

uint8_t spvtools::utils::get_nibble_from_character(int character)

{
  uint8_t uVar1;
  void *pvVar2;
  char cVar3;
  
  pvVar2 = memchr("0123456789",character,0xb);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = memchr("abcdef",character,7);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = memchr("ABCDEF",character,7);
      if (pvVar2 == (void *)0x0) {
        __assert_fail("false && \"This was called with a non-hex character\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/hex_float.h"
                      ,0x2dd,"uint8_t spvtools::utils::get_nibble_from_character(int)");
      }
      cVar3 = ']';
    }
    else {
      cVar3 = 'V';
    }
    uVar1 = ((char)pvVar2 - cVar3) + '\n';
  }
  else {
    uVar1 = (char)pvVar2 + 'k';
  }
  return uVar1;
}

Assistant:

inline uint8_t get_nibble_from_character(int character) {
  const char* dec = "0123456789";
  const char* lower = "abcdef";
  const char* upper = "ABCDEF";
  const char* p = nullptr;
  if ((p = strchr(dec, character))) {
    return static_cast<uint8_t>(p - dec);
  } else if ((p = strchr(lower, character))) {
    return static_cast<uint8_t>(p - lower + 0xa);
  } else if ((p = strchr(upper, character))) {
    return static_cast<uint8_t>(p - upper + 0xa);
  }

  assert(false && "This was called with a non-hex character");
  return 0;
}